

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeIntError DivisionHelper<long,_unsigned_long,_3>::Divide(long *t,uint64_t *u,long *result)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (*in_RSI == 0) {
    local_4 = SafeIntDivideByZero;
  }
  else if (*in_RDI == 0) {
    *in_RDX = 0;
    local_4 = SafeIntNoError;
  }
  else {
    uVar1 = *in_RSI;
    uVar2 = std::numeric_limits<long>::max();
    if (uVar2 < uVar1) {
      lVar3 = *in_RDI;
      lVar4 = std::numeric_limits<long>::min();
      if ((lVar3 == lVar4) &&
         (uVar1 = *in_RSI, uVar2 = std::numeric_limits<long>::min(), uVar1 == uVar2)) {
        *in_RDX = -1;
      }
      else {
        *in_RDX = 0;
      }
    }
    else {
      lVar3 = div_signed_uint64<long,_unsigned_long,_false>::divide(*in_RDI,*in_RSI);
      *in_RDX = lVar3;
    }
    local_4 = SafeIntNoError;
  }
  return local_4;
}

Assistant:

static SafeIntError Divide( const T& t, const std::uint64_t& u, T& result ) SAFEINT_NOTHROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");

        if( u == 0 )
        {
            return SafeIntDivideByZero;
        }

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        if( u <= (std::uint64_t)std::numeric_limits<T>::max() )
        {
            result = div_signed_uint64 < T, U, sizeof(T) < sizeof(std::int64_t) > ::divide(t, u);
        }
        else // Corner case
        if( t == std::numeric_limits<T>::min() && u == (std::uint64_t)std::numeric_limits<T>::min() )
        {
            // Min int divided by it's own magnitude is -1
            result = -1;
        }
        else
        {
            result = 0;
        }
        return SafeIntNoError;
    }